

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

void __thiscall helics::apps::App::App(App *this,string_view defaultAppName,int argc,char **argv)

{
  pointer *__ptr;
  FederateInfo fedInfo;
  undefined1 local_1e8 [448];
  
  this->_vptr_App = (_func_int **)&PTR__App_00445370;
  (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->stopTime).internalTimeCode = 0x7fffffffffffffff;
  (this->configFileName)._M_dataplus._M_p = (pointer)&(this->configFileName).field_2;
  (this->configFileName)._M_string_length = 0;
  (this->configFileName).field_2._M_local_buf[0] = '\0';
  (this->inputFileName)._M_dataplus._M_p = (pointer)&(this->inputFileName).field_2;
  (this->inputFileName)._M_string_length = 0;
  (this->inputFileName).field_2._M_local_buf[0] = '\0';
  (this->outFileName)._M_dataplus._M_p = (pointer)&(this->outFileName).field_2;
  (this->outFileName)._M_string_length = 0;
  (this->outFileName).field_2._M_local_buf[0] = '\0';
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->helpMode = false;
  this->useLocal = false;
  this->fileLoaded = false;
  this->deactivated = false;
  this->quietMode = false;
  local_1e8._12_4_ = argc;
  local_1e8._16_8_ = argv;
  generateParser((App *)local_1e8);
  FederateInfo::FederateInfo((FederateInfo *)(local_1e8 + 0x18));
  FederateInfo::injectParser((FederateInfo *)(local_1e8 + 0x18),(App *)local_1e8._0_8_);
  helicsCLI11App::helics_parse<int&,char**&>
            ((helicsCLI11App *)local_1e8._0_8_,(int *)(local_1e8 + 0xc),(char ***)(local_1e8 + 0x10)
            );
  processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                    *)local_1e8,(FederateInfo *)(local_1e8 + 0x18),defaultAppName);
  FederateInfo::~FederateInfo((FederateInfo *)(local_1e8 + 0x18));
  if ((__uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>)
      local_1e8._0_8_ !=
      (__uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>)0x0) {
    (**(code **)(*(long *)local_1e8._0_8_ + 8))();
  }
  return;
}

Assistant:

App::App(std::string_view defaultAppName, int argc, char* argv[])
{
    auto app = generateParser();
    FederateInfo fedInfo;
    fedInfo.injectParser(app.get());
    app->helics_parse(argc, argv);
    processArgs(app, fedInfo, defaultAppName);
}